

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

graph * lattice::graph::simple(size_t dim,size_t length)

{
  graph *in_RDI;
  unitcell *in_stack_00000080;
  basis *in_stack_00000088;
  graph *in_stack_00000090;
  size_t in_stack_ffffffffffffffd8;
  graph *dim_00;
  
  dim_00 = in_RDI;
  basis::simple(in_stack_ffffffffffffffd8);
  unitcell::simple((size_t)dim_00);
  graph(in_stack_00000090,in_stack_00000088,in_stack_00000080,dim,length._4_4_);
  unitcell::~unitcell((unitcell *)in_RDI);
  basis::~basis((basis *)0x10e2f9);
  return in_RDI;
}

Assistant:

static graph simple(std::size_t dim, std::size_t length) {
    return graph(basis::simple(dim), unitcell::simple(dim), length);
  }